

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_connect(Curl_easy *data,_Bool *done)

{
  unsigned_short *sasl;
  char *value;
  char cVar1;
  short sVar2;
  connectdata *conn;
  char *first;
  int iVar3;
  CURLcode CVar4;
  CURLcode CVar5;
  uchar uVar6;
  size_t len;
  char *pcVar7;
  
  conn = data->conn;
  *done = false;
  CVar5 = CURLE_OK;
  Curl_conncontrol(conn,0);
  (conn->proto).smbc.send_buf = (char *)0x1d4c0;
  (conn->proto).ftpc.pp.statemachine = pop3_statemachine;
  (conn->proto).ftpc.pp.endofresp = pop3_endofresp;
  (conn->proto).pop3c.preftype = '\a';
  sasl = &(conn->proto).imapc.sasl.authmechs;
  Curl_sasl_init((SASL *)sasl,data,&saslpop3);
  Curl_pp_init(&(conn->proto).ftpc.pp);
  first = conn->options;
  if (first != (char *)0x0) {
    cVar1 = *first;
    CVar5 = CURLE_OK;
    while (pcVar7 = first, cVar1 != '\0') {
      for (; (*pcVar7 != '\0' && (*pcVar7 != '=')); pcVar7 = pcVar7 + 1) {
      }
      value = pcVar7 + 1;
      len = 0xffffffffffffffff;
      for (; (*pcVar7 != '\0' && (*pcVar7 != ';')); pcVar7 = pcVar7 + 1) {
        len = len + 1;
      }
      iVar3 = curl_strnequal(first,"AUTH=",5);
      if (iVar3 == 0) {
        CVar5 = CURLE_URL_MALFORMAT;
      }
      else {
        CVar4 = Curl_sasl_parse_url_auth_option((SASL *)sasl,value,len);
        CVar5 = CURLE_OK;
        if ((CVar4 != CURLE_OK) &&
           (iVar3 = curl_strnequal(value,"+APOP",len), CVar5 = CVar4, iVar3 != 0)) {
          (conn->proto).pop3c.preftype = '\x02';
          *(undefined2 *)((long)&conn->proto + 0xd2) = 0;
          CVar5 = CURLE_OK;
        }
      }
      if (CVar5 != CURLE_OK) break;
      first = pcVar7 + (*pcVar7 == ';');
      cVar1 = pcVar7[*pcVar7 == ';'];
    }
  }
  if ((conn->proto).pop3c.preftype != '\x02') {
    sVar2 = *(short *)((long)&conn->proto + 0xd2);
    uVar6 = '\0';
    if (sVar2 != 0) {
      uVar6 = (sVar2 == -0x21) * '\x03' + '\x04';
    }
    (conn->proto).pop3c.preftype = uVar6;
  }
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
  (data->conn->proto).pop3c.state = POP3_SERVERGREET;
  CVar5 = pop3_multi_statemach(data,done);
  return CVar5;
}

Assistant:

static CURLcode pop3_connect(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections in POP3 */
  connkeep(conn, "POP3 default");

  PINGPONG_SETUP(pp, pop3_statemachine, pop3_endofresp);

  /* Set the default preferred authentication type and mechanism */
  pop3c->preftype = POP3_TYPE_ANY;
  Curl_sasl_init(&pop3c->sasl, data, &saslpop3);

  /* Initialise the pingpong layer */
  Curl_pp_init(pp);

  /* Parse the URL options */
  result = pop3_parse_url_options(conn);
  if(result)
    return result;

  /* Start off waiting for the server greeting response */
  pop3_state(data, POP3_SERVERGREET);

  result = pop3_multi_statemach(data, done);

  return result;
}